

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sub.cpp
# Opt level: O0

int __thiscall zmq::sub_t::xsetsockopt(sub_t *this,int option_,void *optval_,size_t optvallen_)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  size_t in_RDX;
  int in_ESI;
  char *errstr;
  uchar *data;
  int rc;
  msg_t msg;
  uchar *in_stack_ffffffffffffff80;
  int echo_;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  msg_t *in_stack_ffffffffffffffa0;
  xsub_t *in_stack_ffffffffffffffa8;
  int local_4;
  
  if ((in_ESI == 6) || (in_ESI == 7)) {
    if (in_ESI == 6) {
      iVar1 = msg_t::init_subscribe
                        ((msg_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         in_RDX,in_stack_ffffffffffffff80);
      echo_ = (int)(in_RDX >> 0x20);
    }
    else {
      iVar1 = msg_t::init_cancel((msg_t *)CONCAT44(in_stack_ffffffffffffff94,
                                                   in_stack_ffffffffffffff90),in_RDX,
                                 in_stack_ffffffffffffff80);
      echo_ = (int)(in_RDX >> 0x20);
    }
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/sub.cpp"
              ,0x42);
      fflush(_stderr);
      zmq_abort((char *)0x2dda25);
    }
    iVar1 = xsub_t::xsend(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    local_4 = close_and_return((msg_t *)CONCAT44(iVar1,in_stack_ffffffffffffff90),echo_);
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int zmq::sub_t::xsetsockopt (int option_,
                             const void *optval_,
                             size_t optvallen_)
{
    if (option_ != ZMQ_SUBSCRIBE && option_ != ZMQ_UNSUBSCRIBE) {
        errno = EINVAL;
        return -1;
    }

    //  Create the subscription message.
    msg_t msg;
    int rc;
    const unsigned char *data = static_cast<const unsigned char *> (optval_);
    if (option_ == ZMQ_SUBSCRIBE) {
        rc = msg.init_subscribe (optvallen_, data);
    } else {
        rc = msg.init_cancel (optvallen_, data);
    }
    errno_assert (rc == 0);

    //  Pass it further on in the stack.
    rc = xsub_t::xsend (&msg);
    return close_and_return (&msg, rc);
}